

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoCube>::Read
          (TPZGeoElRefLess<pzgeom::TPZGeoCube> *this,TPZStream *buf,void *context)

{
  long lVar1;
  
  TPZGeoEl::Read(&this->super_TPZGeoEl,buf,context);
  pztopology::TPZCube::Read((TPZCube *)&this->fGeo,buf,context);
  (*buf->_vptr_TPZStream[0x1f])
            (buf,(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes,8);
  lVar1 = 0x88;
  do {
    (**(code **)(*(long *)((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes
                          + lVar1 + -0x48) + 0x30))
              ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes +
               lVar1 + -0x48,buf,context);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x310);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Read(TPZStream &buf, void *context){
    TPZGeoEl::Read(buf,context);
    fGeo.Read(buf,context);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Read(buf, context);
    }
}